

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sids.cpp
# Opt level: O2

void __thiscall E64::sids_ic::write_byte(sids_ic *this,uint8_t address,uint8_t byte)

{
  size_t in_RCX;
  
  if (-1 < (char)address) {
    SID::write((SID *)(&this->field_0x0 + (ulong)(address >> 5 & 1) * 17000),
               (uint)this->register_index[address & 0x1f],(void *)(ulong)byte,in_RCX);
    return;
  }
  this->balance_registers[address & 7] = byte;
  return;
}

Assistant:

void E64::sids_ic::write_byte(uint8_t address, uint8_t byte)
{
    // each sid requires 32 addresses (of which 29 are used)
    // bit 7 of address determines if a sid chip should be addressed
    // bits 5 determines which sid chip of the two
    // bits 0 to 4 are the actual address within one sid chip
    if(address & 0x80)
    {
        balance_registers[address & 0x07] = byte;
    }
    else
    {
        // nb change 0x20 into 0x60 if four SID chips are being used
        sid[ (address & 0x20) >> 5 ].write( register_index[address & 0x1f], byte); // NEEDS CHECKING!!!
    }
}